

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

wchar_t sftp_cmd_chmod(sftp_command *cmd)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  sftp_command *psVar4;
  _Bool _Var5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  wchar_t wVar9;
  byte *pbVar10;
  byte *pbVar11;
  char *pcVar12;
  ulong uVar13;
  byte *__s;
  undefined8 local_40;
  sftp_command *local_38;
  
  if (backend == (Backend *)0x0) {
    pcVar12 = "psftp: not connected to a host; use \"open host.name\"";
  }
  else if (cmd->nwords < 3) {
    pcVar12 = "chmod: expects a mode specifier and a filename";
  }
  else {
    local_40 = 0;
    __s = (byte *)cmd->words[1];
    psVar4 = cmd;
    if (9 < (byte)(*__s - 0x30)) {
LAB_00111906:
      local_38 = psVar4;
      if (*__s != 0) {
        uVar6 = 0;
        pbVar11 = __s;
LAB_00111916:
        pbVar10 = pbVar11 + 1;
        bVar1 = *pbVar11;
        if (0x6e < bVar1) {
          if (bVar1 == 0x6f) {
            uVar8 = 7;
          }
          else {
            uVar8 = 0x9c0;
            if (bVar1 != 0x75) goto LAB_00111a3f;
          }
LAB_00111950:
          uVar6 = uVar6 | uVar8;
          pbVar11 = pbVar10;
          goto LAB_00111916;
        }
        if (bVar1 == 0x61) {
          uVar8 = 0xdff;
          goto LAB_00111950;
        }
        uVar8 = (uint)bVar1;
        if (uVar8 == 0x67) {
          uVar8 = 0x438;
          goto LAB_00111950;
        }
        if (uVar8 < 0x3e) {
          if ((0x2000280000000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
            if ((*pbVar10 != 0) && (*pbVar10 != 0x2c)) {
              uVar8 = 0;
              pbVar11 = pbVar10;
              goto LAB_001119df;
            }
            sVar7 = strcspn((char *)__s,",");
            uVar6 = (uint)sVar7;
            pcVar12 = "chmod: file mode \'%.*s\' is incomplete\n";
            pbVar11 = pbVar10;
            goto LAB_0011198e;
          }
          if ((0x100000000001U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
            sVar7 = strcspn((char *)__s,",");
            printf("chmod: file mode \'%.*s\' is incomplete\n",sVar7 & 0xffffffff,__s);
            goto LAB_00111a76;
          }
        }
LAB_00111a3f:
        sVar7 = strcspn((char *)__s,",");
        cmd = local_38;
        printf("chmod: file mode \'%.*s\' contains unrecognised user/group/other specifier \'%c\'\n"
               ,sVar7 & 0xffffffff,__s,(ulong)(uint)(int)(char)bVar1);
LAB_00111a76:
        bVar3 = false;
        goto LAB_00111a79;
      }
      goto LAB_00111b92;
    }
    sVar7 = strspn((char *)__s,"01234567");
    if (__s[sVar7] == 0) {
      local_40._0_4_ = 0xfff;
      __isoc99_sscanf(__s,"%o",(long)&local_40 + 4);
      local_40 = CONCAT44(local_40._4_4_ & (uint)local_40,(uint)local_40);
LAB_00111b92:
      wVar9 = L'\x01';
      if (2 < cmd->nwords) {
        uVar13 = 2;
        do {
          _Var5 = wildcard_iterate(cmd->words[uVar13],sftp_action_chmod,&local_40);
          if (!_Var5) {
            wVar9 = L'\0';
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < cmd->nwords);
        return wVar9;
      }
      return L'\x01';
    }
    pcVar12 = "chmod: numeric file modes should contain digits 0-7 only";
  }
  puts(pcVar12);
  return L'\0';
LAB_001119df:
  bVar2 = *pbVar11;
  switch(bVar2) {
  case 0x72:
    uVar8 = uVar8 | 0x124;
    break;
  case 0x73:
    if (((uVar6 & 0xdff) != 0x438) && ((uVar6 & 0xdff) != 0x9c0)) {
      sVar7 = strcspn((char *)__s,",");
      uVar6 = (uint)sVar7;
      pcVar12 = 
      "chmod: file mode \'%.*s\': set[ug]id bit should be used with exactly one of u or g only\n";
      goto LAB_0011198e;
    }
    uVar8 = uVar8 | 0xc00;
    break;
  case 0x74:
    uVar8 = uVar8 | 0x200;
    uVar6 = uVar6 | 0x200;
    break;
  case 0x75:
  case 0x76:
    goto switchD_001119f6_caseD_75;
  case 0x77:
    uVar8 = uVar8 | 0x92;
    break;
  case 0x78:
    uVar8 = uVar8 | 0x49;
    break;
  default:
    if ((bVar2 == 0) || (bVar2 == 0x2c)) {
      if (((uVar6 & 0xdff) == 0) && ((uVar8 & ~uVar6) != 0)) {
        sVar7 = strcspn((char *)__s,",");
        uVar6 = (uint)sVar7;
        pcVar12 = 
        "chmod: file mode \'%.*s\' contains no user/group/other specifier and permissions other than \'t\' \n"
        ;
LAB_0011198e:
        bVar3 = false;
        printf(pcVar12,(ulong)uVar6,__s);
      }
      else {
        uVar8 = uVar8 & uVar6;
        if (bVar1 == 0x3d) {
LAB_00111b52:
          local_40._4_4_ = uVar8 | local_40._4_4_;
          uVar8 = uVar6;
LAB_00111b56:
          local_40._0_4_ = (uint)local_40 | uVar8;
        }
        else {
          if (bVar1 == 0x2d) {
            local_40._4_4_ = ~uVar8 & local_40._4_4_;
            goto LAB_00111b56;
          }
          uVar6 = uVar8;
          if (bVar1 == 0x2b) goto LAB_00111b52;
        }
        pbVar11 = pbVar11 + (*pbVar11 != 0);
        bVar3 = true;
      }
      goto LAB_00111a79;
    }
    goto switchD_001119f6_caseD_75;
  }
  pbVar11 = pbVar11 + 1;
  goto LAB_001119df;
switchD_001119f6_caseD_75:
  sVar7 = strcspn((char *)__s,",");
  bVar3 = false;
  printf("chmod: file mode \'%.*s\' contains unrecognised permission specifier \'%c\'\n",
         sVar7 & 0xffffffff,__s,(ulong)(uint)(int)(char)bVar2);
LAB_00111a79:
  __s = pbVar11;
  psVar4 = local_38;
  if (!bVar3) {
    return L'\0';
  }
  goto LAB_00111906;
}

Assistant:

int sftp_cmd_chmod(struct sftp_command *cmd)
{
    char *mode;
    int i, ret;
    struct sftp_context_chmod ctx[1];

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 3) {
        printf("chmod: expects a mode specifier and a filename\n");
        return 0;
    }

    /*
     * Attempt to parse the mode specifier in cmd->words[1]. We
     * don't support the full horror of Unix chmod; instead we
     * support a much simpler syntax in which the user can either
     * specify an octal number, or a comma-separated sequence of
     * [ugoa]*[-+=][rwxst]+. (The initial [ugoa] sequence may
     * _only_ be omitted if the only attribute mentioned is t,
     * since all others require a user/group/other specification.
     * Additionally, the s attribute may not be specified for any
     * [ugoa] specifications other than exactly u or exactly g.
     */
    ctx->attrs_clr = ctx->attrs_xor = 0;
    mode = cmd->words[1];
    if (mode[0] >= '0' && mode[0] <= '9') {
        if (mode[strspn(mode, "01234567")]) {
            printf("chmod: numeric file modes should"
                   " contain digits 0-7 only\n");
            return 0;
        }
        ctx->attrs_clr = 07777;
        sscanf(mode, "%o", &ctx->attrs_xor);
        ctx->attrs_xor &= ctx->attrs_clr;
    } else {
        while (*mode) {
            char *modebegin = mode;
            unsigned subset, perms;
            int action;

            subset = 0;
            while (*mode && *mode != ',' &&
                   *mode != '+' && *mode != '-' && *mode != '=') {
                switch (*mode) {
                  case 'u': subset |= 04700; break; /* setuid, user perms */
                  case 'g': subset |= 02070; break; /* setgid, group perms */
                  case 'o': subset |= 00007; break; /* just other perms */
                  case 'a': subset |= 06777; break; /* all of the above */
                  default:
                    printf("chmod: file mode '%.*s' contains unrecognised"
                           " user/group/other specifier '%c'\n",
                           (int)strcspn(modebegin, ","), modebegin, *mode);
                    return 0;
                }
                mode++;
            }
            if (!*mode || *mode == ',') {
                printf("chmod: file mode '%.*s' is incomplete\n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            action = *mode++;
            if (!*mode || *mode == ',') {
                printf("chmod: file mode '%.*s' is incomplete\n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            perms = 0;
            while (*mode && *mode != ',') {
                switch (*mode) {
                  case 'r': perms |= 00444; break;
                  case 'w': perms |= 00222; break;
                  case 'x': perms |= 00111; break;
                  case 't': perms |= 01000; subset |= 01000; break;
                  case 's':
                    if ((subset & 06777) != 04700 &&
                        (subset & 06777) != 02070) {
                        printf("chmod: file mode '%.*s': set[ug]id bit should"
                               " be used with exactly one of u or g only\n",
                               (int)strcspn(modebegin, ","), modebegin);
                        return 0;
                    }
                    perms |= 06000;
                    break;
                  default:
                    printf("chmod: file mode '%.*s' contains unrecognised"
                           " permission specifier '%c'\n",
                           (int)strcspn(modebegin, ","), modebegin, *mode);
                    return 0;
                }
                mode++;
            }
            if (!(subset & 06777) && (perms &~ subset)) {
                printf("chmod: file mode '%.*s' contains no user/group/other"
                       " specifier and permissions other than 't' \n",
                       (int)strcspn(modebegin, ","), modebegin);
                return 0;
            }
            perms &= subset;
            switch (action) {
              case '+':
                ctx->attrs_clr |= perms;
                ctx->attrs_xor |= perms;
                break;
              case '-':
                ctx->attrs_clr |= perms;
                ctx->attrs_xor &= ~perms;
                break;
              case '=':
                ctx->attrs_clr |= subset;
                ctx->attrs_xor |= perms;
                break;
            }
            if (*mode) mode++;         /* eat comma */
        }
    }

    ret = 1;
    for (i = 2; i < cmd->nwords; i++)
        ret &= wildcard_iterate(cmd->words[i], sftp_action_chmod, ctx);

    return ret;
}